

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

int Abc_TtNegVar(word *t,int nVars,int iVar)

{
  int iVar1;
  int iVar2;
  word *tLimit;
  int local_30;
  int Step;
  int i_1;
  int nWords;
  int Shift;
  int i;
  int iVar_local;
  int nVars_local;
  word *t_local;
  
  if (nVars <= iVar) {
    __assert_fail("iVar < nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                  ,0x8c0,"int Abc_TtNegVar(word *, int, int)");
  }
  if (nVars < 7) {
    t_local._4_4_ = Abc_Tt6NegVar(*t,iVar);
  }
  else if (iVar < 6) {
    iVar1 = Abc_TtWordNum(nVars);
    for (nWords = 0; nWords < iVar1; nWords = nWords + 1) {
      if ((t[nWords] << ((byte)(1 << ((byte)iVar & 0x1f)) & 0x3f) & t[nWords] & s_Truths6[iVar]) !=
          (t[nWords] & s_Truths6[iVar])) {
        return 0;
      }
    }
    t_local._4_4_ = 1;
  }
  else {
    iVar1 = 1 << ((byte)iVar - 6 & 0x1f);
    iVar2 = Abc_TtWordNum(nVars);
    for (_iVar_local = t; _iVar_local < t + iVar2; _iVar_local = _iVar_local + (iVar1 << 1)) {
      for (local_30 = 0; local_30 < iVar1; local_30 = local_30 + 1) {
        if ((_iVar_local[local_30] & _iVar_local[iVar1 + local_30]) != _iVar_local[iVar1 + local_30]
           ) {
          return 0;
        }
      }
    }
    t_local._4_4_ = 1;
  }
  return t_local._4_4_;
}

Assistant:

static inline int Abc_TtNegVar( word * t, int nVars, int iVar )
{
    assert( iVar < nVars );
    if ( nVars <= 6 )
        return Abc_Tt6NegVar( t[0], iVar );
    if ( iVar < 6 )
    {
        int i, Shift = (1 << iVar);
        int nWords = Abc_TtWordNum( nVars );
        for ( i = 0; i < nWords; i++ )
            if ( ((t[i] << Shift) & t[i] & s_Truths6[iVar]) != (t[i] & s_Truths6[iVar]) )
                return 0;
        return 1;
    }
    else
    {
        int i, Step = (1 << (iVar - 6));
        word * tLimit = t + Abc_TtWordNum( nVars );
        for ( ; t < tLimit; t += 2*Step )
            for ( i = 0; i < Step; i++ )
                if ( (t[i] & t[Step+i]) != t[Step+i] )
                    return 0;
        return 1;
    }
}